

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  AsyncCapabilityStream *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  void *pvVar3;
  undefined4 in_register_00000034;
  bool bVar4;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_50;
  
  bVar4 = __n == 0;
  if (!bVar4) {
    sVar1 = *(size_t *)((long)__buf + 8);
    while (sVar1 == 0) {
      bVar4 = __n == 1;
      if (bVar4) goto LAB_00425f42;
      __n = __n - 1;
      sVar1 = ((ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10))->size_;
      __buf = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
    }
    if (!bVar4) {
      pAVar2 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
      if (pAVar2 != (AsyncCapabilityStream *)0x0) {
        (*(pAVar2->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream[1])
                  (this,&(pAVar2->super_AsyncIoStream).super_AsyncOutputStream,__buf);
        return (ssize_t)this;
      }
      pvVar3 = operator_new(0x400);
      *(undefined8 *)((long)pvVar3 + 0x1d8) = 0;
      *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
      *(undefined ***)((long)pvVar3 + 0x1d0) = &PTR_destroy_006471d0;
      *(undefined ***)((long)pvVar3 + 0x1e8) = &PTR_reject_00647220;
      *(undefined1 *)((long)pvVar3 + 0x1f0) = 0;
      *(undefined1 *)((long)pvVar3 + 0x388) = 0;
      *(undefined1 *)((long)pvVar3 + 0x390) = 1;
      local_50.tag = 0;
      morePieces.size_ = __n - 1;
      morePieces.ptr = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
      BlockedWrite::BlockedWrite
                ((BlockedWrite *)((long)pvVar3 + 0x398),
                 (PromiseFulfiller<void> *)((long)pvVar3 + 0x1e8),
                 (AsyncPipe *)CONCAT44(in_register_00000034,__fd),*__buf,morePieces,&local_50);
      OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
      ::destroy(&local_50);
      *(void **)((long)pvVar3 + 0x1d8) = pvVar3;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x1d0);
      return (ssize_t)this;
    }
  }
LAB_00425f42:
  kj::_::readyNow();
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)CONCAT44(local_50._4_4_,local_50.tag);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }